

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void SHA1Update(SHA1_CTX *context,uchar *data,uint32_t len)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong __n;
  
  uVar3 = context->count[0];
  context->count[0] = len * 8 + uVar3;
  if (CARRY4(len * 8,uVar3)) {
    context->count[1] = context->count[1] + 1;
  }
  context->count[1] = context->count[1] + (len >> 0x1d);
  uVar3 = uVar3 >> 3 & 0x3f;
  uVar2 = (ulong)uVar3;
  if (len + uVar3 < 0x40) {
    __n = 0;
  }
  else {
    __n = (ulong)(0x40 - uVar3);
    memcpy(context->buffer + uVar2,data,__n);
    SHA1Transform(context->state,context->buffer);
    uVar1 = uVar3 ^ 0x7f;
    if ((uVar3 ^ 0x7f) < len) {
      do {
        uVar3 = uVar1;
        SHA1Transform(context->state,data + (uVar3 - 0x3f));
        uVar1 = uVar3 + 0x40;
      } while (uVar3 + 0x40 < len);
      uVar2 = 0;
      __n = (ulong)(uVar3 + 1);
    }
    else {
      uVar2 = 0;
    }
  }
  memcpy(context->buffer + uVar2,data + __n,(ulong)(len - (int)__n));
  return;
}

Assistant:

static void SHA1Update(SHA1_CTX *context, const unsigned char *data,
                       uint32_t len) {
  uint32_t i, j;

  j = context->count[0];
  if ((context->count[0] += len << 3) < j)
    context->count[1]++;
  context->count[1] += (len>>29);
  j = (j >> 3) & 63;
  if ((j + len) > 63) {
    memcpy(&context->buffer[j], data, (i = 64-j));
    SHA1Transform(context->state, context->buffer);
    for ( ; i + 63 < len; i += 64) {
      SHA1Transform(context->state, &data[i]);
    }
    j = 0;
  }
  else i = 0;
  memcpy(&context->buffer[j], &data[i], len - i);
}